

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlogging.c
# Opt level: O2

void LogBinary(char *comment,void *data,size_t size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  char *pcVar5;
  byte bVar6;
  char cVar7;
  void *pvVar8;
  bool bVar9;
  char charBuf [17];
  char hexBuf [49];
  
  if (global_log_function != (LOGGER_LOG)0x0) {
    (*global_log_function)
              (AZ_LOG_TRACE,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/xlogging.c"
               ,"LogBinary",0x3b,1,"%s     %lu bytes",comment,size);
  }
  pvVar8 = (void *)((long)data + 1);
  lVar2 = 0;
  while (bVar9 = size != 0, size = size - 1, bVar9) {
    bVar4 = *(byte *)((long)pvVar8 + -1);
    bVar6 = bVar4;
    if (0x5e < (byte)(bVar4 - 0x20)) {
      bVar6 = 0x2e;
    }
    charBuf[lVar2] = bVar6;
    cVar7 = (bVar4 >> 4) + 0x37;
    if (bVar4 < 0xa0) {
      cVar7 = (bVar4 >> 4) + 0x30;
    }
    lVar1 = lVar2 * 3;
    hexBuf[lVar1] = cVar7;
    bVar4 = bVar4 & 0xf;
    cVar7 = bVar4 + 0x37;
    if (bVar4 < 10) {
      cVar7 = bVar4 + 0x30;
    }
    hexBuf[lVar1 + 1] = cVar7;
    hexBuf[lVar1 + 2] = ' ';
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x10) {
      charBuf[0x10] = '\0';
      hexBuf[0x30] = '\0';
      if (global_log_function != (LOGGER_LOG)0x0) {
        (*global_log_function)
                  (AZ_LOG_TRACE,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/xlogging.c"
                   ,"LogBinary",0x52,1,"%p: %s    %s",data,hexBuf,charBuf);
      }
      lVar2 = 0;
      data = pvVar8;
    }
    pvVar8 = (void *)((long)pvVar8 + 1);
  }
  if (lVar2 != 0) {
    charBuf[lVar2] = '\0';
    pcVar5 = hexBuf + lVar2 * 3;
    uVar3 = lVar2 - 1;
    do {
      pcVar5[0] = ' ';
      pcVar5[1] = ' ';
      pcVar5[2] = ' ';
      pcVar5 = pcVar5 + 3;
      uVar3 = uVar3 + 1;
    } while (uVar3 < 0xf);
    *pcVar5 = '\0';
    if (global_log_function != (LOGGER_LOG)0x0) {
      (*global_log_function)
                (AZ_LOG_TRACE,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/xlogging.c"
                 ,"LogBinary",0x6b,1,"%p: %s    %s",data,hexBuf,charBuf);
    }
  }
  return;
}

Assistant:

void LogBinary(const char* comment, const void* data, size_t size)
{
    char charBuf[LINE_SIZE + 1];
    char hexBuf[LINE_SIZE * 3 + 1];
    size_t countbuf = 0;
    size_t i = 0;
    const unsigned char* bufAsChar = (const unsigned char*)data;
    const unsigned char* startPos = bufAsChar;

    LOG(AZ_LOG_TRACE, LOG_LINE, "%s     %lu bytes", comment, (unsigned long)size);

    /* Print the whole buffer. */
    for (i = 0; i < size; i++)
    {
        /* Store the printable value of the char in the charBuf to print. */
        charBuf[countbuf] = PRINTABLE(*bufAsChar);

        /* Convert the high nibble to a printable hexadecimal value. */
        hexBuf[countbuf * 3] = HEX_STR(*bufAsChar >> 4);

        /* Convert the low nibble to a printable hexadecimal value. */
        hexBuf[countbuf * 3 + 1] = HEX_STR(*bufAsChar);

        hexBuf[countbuf * 3 + 2] = ' ';

        countbuf++;
        bufAsChar++;
        /* If the line is full, print it to start another one. */
        if (countbuf == LINE_SIZE)
        {
            charBuf[countbuf] = '\0';
            hexBuf[countbuf * 3] = '\0';
            LOG(AZ_LOG_TRACE, LOG_LINE, "%p: %s    %s", startPos, hexBuf, charBuf);
            countbuf = 0;
            startPos = bufAsChar;
        }
    }

    /* If the last line does not fit the line size. */
    if (countbuf > 0)
    {
        /* Close the charBuf string. */
        charBuf[countbuf] = '\0';
        hexBuf[countbuf * 3] = ' ';
        hexBuf[countbuf * 3 + 1] = ' ';
        hexBuf[countbuf * 3 + 2] = ' ';

        /* Fill the hexBuf with spaces to keep the charBuf alignment. */
        while ((countbuf++) < LINE_SIZE - 1)
        {
            hexBuf[countbuf * 3] = ' ';
            hexBuf[countbuf * 3 + 1] = ' ';
            hexBuf[countbuf * 3 + 2] = ' ';
        }
        hexBuf[countbuf * 3] = '\0';

        /* Print the last line. */
        LOG(AZ_LOG_TRACE, LOG_LINE, "%p: %s    %s", startPos, hexBuf, charBuf);
    }
}